

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netban.cpp
# Opt level: O3

void __thiscall CNetBan::CBanPool<NETADDR,_1>::Reset(CBanPool<NETADDR,_1> *this)

{
  CBan<NETADDR> *pCVar1;
  long lVar2;
  
  mem_zero(this,0x800);
  mem_zero(this->m_aBans,0x22000);
  this->m_pFirstUsed = (CBan<NETADDR> *)0x0;
  this->m_CountUsed = 0;
  pCVar1 = this->m_aBans + 2;
  lVar2 = 0x3fe;
  do {
    pCVar1[-1].m_pNext = pCVar1;
    pCVar1[-1].m_pPrev = pCVar1 + -2;
    pCVar1 = pCVar1 + 1;
    lVar2 = lVar2 + -1;
  } while (lVar2 != 0);
  this->m_aBans[0].m_pNext = this->m_aBans + 1;
  this->m_aBans[0x3ff].m_pPrev = this->m_aBans + 0x3fe;
  this->m_pFirstFree = this->m_aBans;
  return;
}

Assistant:

void CNetBan::CBanPool<T, HashCount>::Reset()
{
	mem_zero(m_paaHashList, sizeof(m_paaHashList));
	mem_zero(m_aBans, sizeof(m_aBans));
	m_pFirstUsed = 0;
	m_CountUsed = 0;

	for(int i = 1; i < MAX_BANS-1; ++i)
	{
		m_aBans[i].m_pNext = &m_aBans[i+1];
		m_aBans[i].m_pPrev = &m_aBans[i-1];
	}

	m_aBans[0].m_pNext = &m_aBans[1];
	m_aBans[MAX_BANS-1].m_pPrev = &m_aBans[MAX_BANS-2];
	m_pFirstFree = &m_aBans[0];
}